

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O0

void __thiscall
wasm::OrderedFixedStorage<unsigned_int,_3UL>::OrderedFixedStorage
          (OrderedFixedStorage<unsigned_int,_3UL> *this)

{
  OrderedFixedStorage<unsigned_int,_3UL> *this_local;
  
  FixedStorageBase<unsigned_int,_3UL>::FixedStorageBase
            (&this->super_FixedStorageBase<unsigned_int,_3UL>);
  return;
}

Assistant:

InsertResult insert(const T& x) {
    // Find the insertion point |i| where x should be placed.
    size_t i = 0;
    while (i < this->used && this->storage[i] < x) {
      i++;
    }
    if (i < this->used && this->storage[i] == x) {
      // The item already exists.
      return InsertResult::NoError;
    }
    // |i| is now the location where x should be placed.

    assert(this->used <= N);
    if (this->used == N) {
      return InsertResult::CouldNotInsert;
    }

    if (i != this->used) {
      // Push things forward to make room for x.
      for (size_t j = this->used; j >= i + 1; j--) {
        this->storage[j] = this->storage[j - 1];
      }
    }

    this->storage[i] = x;
    this->used++;
    return InsertResult::NoError;
  }